

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O3

outer_range_iterator __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
::semiintersection_end
          (semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
           *this)

{
  __normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
  __nth;
  size_t sVar1;
  integer_range<int> *piVar2;
  __normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
  __last;
  long lVar3;
  difference_type dVar4;
  ulong uVar5;
  __normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
  __first;
  _Iter_comp_iter<burst::compose_fn<burst::apply_fn<std::less<void>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
  in_stack_ffffffffffffffb8;
  int local_3c;
  transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_boost::use_default,_boost::use_default>
  local_38;
  transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_iterator_semiintersect_iterator_hpp:219:52),_int>,___gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_boost::use_default,_boost::use_default>
  local_28;
  
  sVar1 = this->m_min_items;
  piVar2 = (this->m_begin)._M_current;
  local_3c = piVar2[sVar1 - 1].super_iterator_range<boost::range_detail::integer_iterator<int>_>.
             super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
             .
             super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin.m_value;
  if (local_3c !=
      piVar2[sVar1 - 1].super_iterator_range<boost::range_detail::integer_iterator<int>_>.
      super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      .m_End.m_value) {
    local_38.super_type.m_iterator._M_current =
         (__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
          )(this->m_end)._M_current;
    local_28.super_type.m_iterator._M_current =
         (__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
          )(piVar2 + sVar1);
    __first._M_current = piVar2 + (sVar1 - 1);
    local_28.m_f.m_impl.super_type.m_initialized = true;
    local_38.m_f.m_impl.super_type.m_initialized = true;
    dVar4 = std::
            __count_if<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>,std::less<void>>::semiintersection_end()::_lambda(auto:1_const&)_1_,int>,__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>,boost::use_default,boost::use_default>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (&local_28,&local_38,(_Iter_equals_val<const_int>)&local_3c);
    __nth._M_current = __first._M_current + dVar4;
    __last._M_current = (this->m_end)._M_current;
    if (__nth._M_current != __last._M_current && __first._M_current != __last._M_current) {
      uVar5 = (long)__last._M_current - (long)__first._M_current >> 3;
      lVar3 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introselect<__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<burst::compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
                (__first,__nth,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                 in_stack_ffffffffffffffb8);
    }
    return (outer_range_iterator)(__nth._M_current + 1);
  }
  __assert_fail("!empty()","/usr/include/boost/range/iterator_range_core.hpp",0xff,
                "reference boost::iterator_range_detail::iterator_range_base<boost::range_detail::integer_iterator<int>, boost::iterators::incrementable_traversal_tag>::front() const [IteratorT = boost::range_detail::integer_iterator<int>, TraversalTag = boost::iterators::incrementable_traversal_tag]"
               );
}

Assistant:

outer_range_iterator semiintersection_candidate ()
        {
            using difference_type = iterator_difference_t<outer_range_iterator>;
            return m_begin + static_cast<difference_type>(m_min_items - 1);
        }